

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O0

int __thiscall
soplex::
ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
::number(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
         *this,DLPSV *item)

{
  int iVar1;
  long lVar2;
  SPxException *this_00;
  long in_RSI;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *in_RDI;
  ptrdiff_t idx;
  string *in_stack_ffffffffffffff88;
  allocator local_39;
  string local_38 [32];
  long local_18;
  
  lVar2 = (in_RSI - (long)in_RDI->theitem) / 0x28;
  local_18 = lVar2;
  if (-1 < lVar2) {
    iVar1 = size(in_RDI);
    if (lVar2 < iVar1) {
      return in_RDI->theitem[local_18].info;
    }
  }
  this_00 = (SPxException *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Invalid index",&local_39);
  SPxException::SPxException(this_00,in_stack_ffffffffffffff88);
  __cxa_throw(this_00,&SPxException::typeinfo,SPxException::~SPxException);
}

Assistant:

int number(const T* item) const
   {
      ptrdiff_t idx = reinterpret_cast<const struct Item*>(item) - theitem;

      if(idx < 0 || idx >= size())
         throw SPxException("Invalid index");

      return theitem[idx].info;
   }